

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O1

void WebPRescalerImportRowExpand_C(WebPRescaler *wrk,uint8_t *src)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  rescaler_t *prVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  rescaler_t *prVar16;
  uint uVar17;
  
  uVar2 = wrk->num_channels;
  lVar8 = (long)(int)uVar2;
  if (0 < lVar8) {
    iVar9 = wrk->dst_width * uVar2;
    iVar3 = wrk->x_add;
    iVar4 = wrk->src_width;
    prVar6 = wrk->frow;
    lVar11 = 0;
    uVar13 = uVar2;
    do {
      bVar1 = src[lVar11];
      uVar14 = (uint)bVar1;
      uVar17 = (uint)bVar1;
      if (1 < iVar4) {
        uVar17 = (uint)src[lVar11 + lVar8];
      }
      prVar6[lVar11] = iVar3 * (uint)bVar1;
      if ((int)(uVar2 + (int)lVar11) < iVar9) {
        prVar16 = prVar6 + uVar13;
        iVar5 = wrk->x_sub;
        iVar15 = uVar2 + (int)lVar11;
        iVar10 = iVar3;
        uVar12 = uVar13;
        do {
          iVar10 = iVar10 - iVar5;
          uVar7 = uVar17;
          if (iVar10 < 0) {
            iVar15 = iVar15 + uVar2;
            iVar10 = iVar10 + iVar3;
            uVar7 = (uint)src[iVar15];
            uVar14 = uVar17;
          }
          uVar17 = uVar7;
          *prVar16 = (uVar14 - uVar17) * iVar10 + uVar17 * iVar3;
          prVar16 = prVar16 + lVar8;
          uVar12 = uVar12 + uVar2;
        } while ((int)uVar12 < iVar9);
      }
      lVar11 = lVar11 + 1;
      uVar13 = uVar13 + 1;
    } while (lVar11 != lVar8);
  }
  return;
}

Assistant:

void WebPRescalerImportRowExpand_C(WebPRescaler* WEBP_RESTRICT const wrk,
                                   const uint8_t* WEBP_RESTRICT src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    // simple bilinear interpolation
    int accum = wrk->x_add;
    rescaler_t left = (rescaler_t)src[x_in];
    rescaler_t right =
        (wrk->src_width > 1) ? (rescaler_t)src[x_in + x_stride] : left;
    x_in += x_stride;
    while (1) {
      wrk->frow[x_out] = right * wrk->x_add + (left - right) * accum;
      x_out += x_stride;
      if (x_out >= x_out_max) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        left = right;
        x_in += x_stride;
        assert(x_in < wrk->src_width * x_stride);
        right = (rescaler_t)src[x_in];
        accum += wrk->x_add;
      }
    }
    assert(wrk->x_sub == 0 /* <- special case for src_width=1 */ || accum == 0);
  }
}